

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result init_audio_buffer(Emulator *e,u32 frequency,u32 frames)

{
  ulong __size;
  u8 *puVar1;
  bool bVar2;
  size_t buffer_size;
  AudioBuffer *audio_buffer;
  u32 frames_local;
  u32 frequency_local;
  Emulator *e_local;
  
  (e->audio_buffer).frames = frames;
  __size = (ulong)((frames + 0x100) * 2);
  puVar1 = (u8 *)malloc(__size);
  (e->audio_buffer).data = puVar1;
  bVar2 = (e->audio_buffer).data != (u8 *)0x0;
  if (bVar2) {
    (e->audio_buffer).end = (e->audio_buffer).data + __size;
    (e->audio_buffer).position = (e->audio_buffer).data;
    (e->audio_buffer).frequency = frequency;
  }
  else {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",0x127b
           );
    fprintf(_stderr,"Audio buffer allocation failed.\n");
  }
  e_local._4_4_ = (Result)!bVar2;
  return e_local._4_4_;
}

Assistant:

Result init_audio_buffer(Emulator* e, u32 frequency, u32 frames) {
  AudioBuffer* audio_buffer = &e->audio_buffer;
  audio_buffer->frames = frames;
  size_t buffer_size =
      (frames + AUDIO_BUFFER_EXTRA_FRAMES) * SOUND_OUTPUT_COUNT;
  audio_buffer->data = xmalloc(buffer_size);
  CHECK_MSG(audio_buffer->data != NULL, "Audio buffer allocation failed.\n");
  audio_buffer->end = audio_buffer->data + buffer_size;
  audio_buffer->position = audio_buffer->data;
  audio_buffer->frequency = frequency;
  return OK;
  ON_ERROR_RETURN;
}